

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

Bool GetRgb(ctmbstr color,int *rgb)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  uint local_24;
  uint x;
  int *rgb_local;
  ctmbstr color_local;
  
  local_24 = 0;
  while( true ) {
    if (0x93 < local_24) {
      uVar1 = prvTidytmbstrlen(color);
      if ((uVar1 == 7) && (*color == '#')) {
        iVar2 = ctox(color[1]);
        iVar3 = ctox(color[2]);
        *rgb = iVar2 * 0x10 + iVar3;
        iVar2 = ctox(color[3]);
        iVar3 = ctox(color[4]);
        rgb[1] = iVar2 * 0x10 + iVar3;
        iVar2 = ctox(color[5]);
        iVar3 = ctox(color[6]);
        rgb[2] = iVar2 * 0x10 + iVar3;
        color_local._4_4_ = yes;
      }
      else {
        color_local._4_4_ = no;
      }
      return color_local._4_4_;
    }
    pcVar4 = strstr(colorNames[local_24],color);
    if (pcVar4 != (char *)0x0) break;
    local_24 = local_24 + 1;
  }
  *rgb = colorValues[local_24][0];
  rgb[1] = colorValues[local_24][1];
  rgb[2] = colorValues[local_24][2];
  return yes;
}

Assistant:

static Bool GetRgb( ctmbstr color, int rgb[] )
{
    uint x;

    /* Check if we have a color name */
    for (x = 0; x < N_COLORS; x++)
    {
        if ( strstr(colorNames[x], color) != NULL )
        {
            rgb[0] = colorValues[x][0];
            rgb[1] = colorValues[x][1];
            rgb[2] = colorValues[x][2];
            return yes;
        }
    }

    /*
       No color name so must be hex values 
       Is this a number in hexadecimal format?
    */
    
    /* Must be 7 characters in the RGB value (including '#') */
    if ( TY_(tmbstrlen)(color) == 7 && color[0] == '#' )
    {
        rgb[0] = (ctox(color[1]) * 16) + ctox(color[2]);
        rgb[1] = (ctox(color[3]) * 16) + ctox(color[4]);
        rgb[2] = (ctox(color[5]) * 16) + ctox(color[6]);
        return yes;
    }
    return no;
}